

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unswitch_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::anon_unknown_0::LoopUnswitch::IsDynamicallyUniform
          (LoopUnswitch *this,Instruction *var,BasicBlock *entry,DominatorTree *post_dom_tree)

{
  bool *this_00;
  iterator this_01;
  bool bVar1;
  uint32_t uVar2;
  uint32_t b;
  Op OVar3;
  pointer ppVar4;
  Instruction *this_02;
  anon_class_24_3_12119ced local_e8;
  function<bool_(unsigned_int_*)> local_d0;
  uint32_t local_ac;
  Instruction *pIStack_a8;
  StorageClass storage_class;
  Instruction *PtrTypeInst;
  BasicBlock *pBStack_98;
  uint32_t PtrTypeId;
  BasicBlock *parent;
  function<bool_(const_spvtools::opt::Instruction_&)> local_88;
  uint32_t local_64;
  BasicBlock *local_60;
  bool *is_uniform;
  DecorationManager *dec_mgr;
  uint32_t local_44;
  _Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false> local_40;
  iterator it;
  DefUseManager *def_use_mgr;
  DominatorTree *post_dom_tree_local;
  BasicBlock *entry_local;
  Instruction *var_local;
  LoopUnswitch *this_local;
  
  bVar1 = DominatorTree::IsPostDominator(post_dom_tree);
  if (!bVar1) {
    __assert_fail("post_dom_tree.IsPostDominator()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp"
                  ,0x1ed,
                  "bool spvtools::opt::(anonymous namespace)::LoopUnswitch::IsDynamicallyUniform(Instruction *, const BasicBlock *, const DominatorTree &)"
                 );
  }
  it.super__Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false>)
       IRContext::get_def_use_mgr(this->context_);
  local_44 = Instruction::result_id(var);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
       ::find(&this->dynamically_uniform_,&local_44);
  dec_mgr = (DecorationManager *)
            std::
            unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
            ::end(&this->dynamically_uniform_);
  bVar1 = std::__detail::operator!=
                    (&local_40,
                     (_Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false> *)&dec_mgr);
  if (bVar1) {
    ppVar4 = std::__detail::_Node_iterator<std::pair<const_unsigned_int,_bool>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_int,_bool>,_false,_false> *)
                        &local_40);
    this_local._7_1_ = (bool)(ppVar4->second & 1);
  }
  else {
    is_uniform = (bool *)IRContext::get_decoration_mgr(this->context_);
    local_64 = Instruction::result_id(var);
    local_60 = (BasicBlock *)
               std::
               unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
               ::operator[](&this->dynamically_uniform_,&local_64);
    this_00 = is_uniform;
    *(mapped_type *)&local_60->function_ = false;
    uVar2 = Instruction::result_id(var);
    parent = local_60;
    std::function<bool(spvtools::opt::Instruction_const&)>::
    function<spvtools::opt::(anonymous_namespace)::LoopUnswitch::IsDynamicallyUniform(spvtools::opt::Instruction*,spvtools::opt::BasicBlock_const*,spvtools::opt::DominatorTree_const&)::_lambda(spvtools::opt::Instruction_const&)_1_,void>
              ((function<bool(spvtools::opt::Instruction_const&)> *)&local_88,
               (anon_class_8_1_e5cb0d5d *)&parent);
    analysis::DecorationManager::WhileEachDecoration
              ((DecorationManager *)this_00,uVar2,0x1a,&local_88);
    std::function<bool_(const_spvtools::opt::Instruction_&)>::~function(&local_88);
    if (((ulong)local_60->function_ & 1) == 0) {
      pBStack_98 = IRContext::get_instr_block(this->context_,var);
      if (pBStack_98 == (BasicBlock *)0x0) {
        *(mapped_type *)&local_60->function_ = true;
        this_local._7_1_ = true;
      }
      else {
        uVar2 = BasicBlock::id(pBStack_98);
        b = BasicBlock::id(entry);
        bVar1 = DominatorTree::Dominates(post_dom_tree,uVar2,b);
        if (bVar1) {
          OVar3 = Instruction::opcode(var);
          this_01 = it;
          if (OVar3 == OpLoad) {
            uVar2 = Instruction::GetSingleWordInOperand(var,0);
            this_02 = analysis::DefUseManager::GetDef
                                ((DefUseManager *)
                                 this_01.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false>
                                 ._M_cur,uVar2);
            PtrTypeInst._4_4_ = Instruction::type_id(this_02);
            pIStack_a8 = analysis::DefUseManager::GetDef
                                   ((DefUseManager *)
                                    it.
                                    super__Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false>
                                    ._M_cur,PtrTypeInst._4_4_);
            local_ac = Instruction::GetSingleWordInOperand(pIStack_a8,0);
            if ((local_ac != 2) && (local_ac != 0)) {
              *(mapped_type *)&local_60->function_ = false;
              return false;
            }
          }
          else {
            bVar1 = IRContext::IsCombinatorInstruction(this->context_,var);
            if (!bVar1) {
              *(mapped_type *)&local_60->function_ = false;
              return false;
            }
          }
          local_e8.entry = entry;
          local_e8.post_dom_tree = post_dom_tree;
          local_e8.this = this;
          std::function<bool(unsigned_int*)>::
          function<spvtools::opt::(anonymous_namespace)::LoopUnswitch::IsDynamicallyUniform(spvtools::opt::Instruction*,spvtools::opt::BasicBlock_const*,spvtools::opt::DominatorTree_const&)::_lambda(unsigned_int_const*)_1_,void>
                    ((function<bool(unsigned_int*)> *)&local_d0,&local_e8);
          this_local._7_1_ = Instruction::WhileEachInId(var,&local_d0);
          *(bool *)&local_60->function_ = this_local._7_1_;
          std::function<bool_(unsigned_int_*)>::~function(&local_d0);
        }
        else {
          *(mapped_type *)&local_60->function_ = false;
          this_local._7_1_ = false;
        }
      }
    }
    else {
      this_local._7_1_ = (bool)(*(mapped_type *)&local_60->function_ & 1);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool IsDynamicallyUniform(Instruction* var, const BasicBlock* entry,
                            const DominatorTree& post_dom_tree) {
    assert(post_dom_tree.IsPostDominator());
    analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

    auto it = dynamically_uniform_.find(var->result_id());

    if (it != dynamically_uniform_.end()) return it->second;

    analysis::DecorationManager* dec_mgr = context_->get_decoration_mgr();

    bool& is_uniform = dynamically_uniform_[var->result_id()];
    is_uniform = false;

    dec_mgr->WhileEachDecoration(var->result_id(),
                                 uint32_t(spv::Decoration::Uniform),
                                 [&is_uniform](const Instruction&) {
                                   is_uniform = true;
                                   return false;
                                 });
    if (is_uniform) {
      return is_uniform;
    }

    BasicBlock* parent = context_->get_instr_block(var);
    if (!parent) {
      return is_uniform = true;
    }

    if (!post_dom_tree.Dominates(parent->id(), entry->id())) {
      return is_uniform = false;
    }
    if (var->opcode() == spv::Op::OpLoad) {
      const uint32_t PtrTypeId =
          def_use_mgr->GetDef(var->GetSingleWordInOperand(0))->type_id();
      const Instruction* PtrTypeInst = def_use_mgr->GetDef(PtrTypeId);
      auto storage_class = spv::StorageClass(
          PtrTypeInst->GetSingleWordInOperand(kTypePointerStorageClassInIdx));
      if (storage_class != spv::StorageClass::Uniform &&
          storage_class != spv::StorageClass::UniformConstant) {
        return is_uniform = false;
      }
    } else {
      if (!context_->IsCombinatorInstruction(var)) {
        return is_uniform = false;
      }
    }

    return is_uniform = var->WhileEachInId([entry, &post_dom_tree,
                                            this](const uint32_t* id) {
      return IsDynamicallyUniform(context_->get_def_use_mgr()->GetDef(*id),
                                  entry, post_dom_tree);
    });
  }